

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManPrintSigs(Aig_VSig_t *pSigs,int nVars)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  int v;
  int nVars_local;
  Aig_VSig_t *pSigs_local;
  
  for (k = 0; k < nVars; k = k + 1) {
    printf("%2d : ",(ulong)(uint)k);
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      printf("%5d  ",(ulong)(uint)pSigs[k * 2 + local_20].nOnes);
      printf("(");
      for (local_1c = 0; local_1c < nVars; local_1c = local_1c + 1) {
        printf("%4d ",(ulong)(uint)pSigs[k * 2 + local_20].nCofOnes[local_1c]);
      }
      printf(")  ");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Aig_RManPrintSigs( Aig_VSig_t * pSigs, int nVars )
{
    int v, i, k;
    for ( v = 0; v < nVars; v++ )
    {
        printf( "%2d : ", v );
        for ( k = 0; k < 2; k++ )
        {
            printf( "%5d  ", pSigs[2*v+k].nOnes );
            printf( "(" );
            for ( i = 0; i < nVars; i++ )
                printf( "%4d ", pSigs[2*v+k].nCofOnes[i] );
            printf( ")  " );
        }
        printf( "\n" );
    }
}